

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Gather_flat64(int g_a,void *v,int64_t *subsArray,int64_t n)

{
  char *str;
  void *__ptr;
  long in_RCX;
  long in_RDX;
  Integer *_subs_array;
  Integer ndim;
  Integer nv;
  Integer a;
  int i;
  int idx;
  Integer in_stack_000001b0;
  Integer in_stack_000001d0;
  Integer in_stack_000001d8;
  void *in_stack_000001e0;
  void *in_stack_000001e8;
  Integer in_stack_000001f0;
  int local_28;
  int local_24;
  
  str = (char *)pnga_ndim(in_stack_000001b0);
  __ptr = malloc((int)str * in_RCX * 8);
  if (__ptr == (void *)0x0) {
    GA_Error(str,0);
  }
  for (local_24 = 0; local_24 < in_RCX; local_24 = local_24 + 1) {
    for (local_28 = 0; (long)local_28 < (long)str; local_28 = local_28 + 1) {
      *(long *)((long)__ptr + (long)(str + (long)local_24 * (long)str + (-1 - (long)local_28)) * 8)
           = *(long *)(in_RDX + ((long)local_24 * (long)str + (long)local_28) * 8) + 1;
    }
  }
  pnga_gather(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
              in_stack_000001d0);
  free(__ptr);
  return;
}

Assistant:

void NGA_Gather_flat64(int g_a, void *v, int64_t subsArray[], int64_t n)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_gather(a, v, _subs_array, 0, nv);
    
    free(_subs_array);
}